

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

void __thiscall
cbtCollisionWorld::debugDrawObject
          (cbtCollisionWorld *this,cbtTransform *worldTransform,cbtCollisionShape *shape,
          cbtVector3 *color)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  cbtScalar cVar11;
  cbtScalar cVar12;
  cbtScalar cVar13;
  cbtScalar cVar14;
  cbtScalar cVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined4 uVar20;
  void *pvVar21;
  double *pdVar22;
  ulong *puVar23;
  ulong *puVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  cbtCollisionShape *pcVar28;
  int iVar29;
  int iVar30;
  uint uVar31;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar32;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  long *plVar33;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  long lVar34;
  long lVar35;
  long lVar36;
  cbtBoxShape *boxShape;
  long lVar37;
  ulong uVar38;
  code *UNRECOVERED_JUMPTABLE;
  cbtConvexTriangleMeshShape *convexMesh;
  long lVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float in_XMM0_Da;
  float fVar52;
  float fVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar61 [12];
  undefined1 in_ZMM3 [64];
  float fVar62;
  undefined1 auVar63 [12];
  undefined1 in_ZMM5 [64];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  cbtVector3 b;
  cbtConcaveShape *concaveMesh;
  cbtVector3 halfExtents;
  cbtVector3 wa;
  cbtVector3 wb;
  float local_138;
  float local_128;
  float local_108;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  long local_e8;
  cbtCollisionShape *local_e0;
  long local_d8;
  cbtVector3 *local_d0;
  undefined1 local_c8 [8];
  cbtInternalTriangleIndexCallback cStack_c0;
  undefined8 local_b8;
  ulong local_b0;
  undefined8 uStack_a8;
  ulong local_a0;
  undefined1 auStack_98 [16];
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined1 local_60 [16];
  long local_50;
  long local_48;
  undefined1 local_40 [16];
  undefined4 extraout_var_07;
  
  auVar51 = in_ZMM17._0_16_;
  auVar42 = in_ZMM16._0_16_;
  auVar63 = in_ZMM5._4_12_;
  auVar61 = in_ZMM3._4_12_;
  iVar29 = (*this->_vptr_cbtCollisionWorld[5])();
  if (CONCAT44(extraout_var,iVar29) != 0) {
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    in_XMM0_Da = (float)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar29) + 0x70))
                                  ((long *)CONCAT44(extraout_var_00,iVar29));
  }
  iVar29 = shape->m_shapeType;
  if (0x21 < iVar29) {
    if (iVar29 == 0x22) {
      uVar20 = *(undefined4 *)&shape[2].m_userPointer;
      iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_12,iVar29) + 0xc0);
      (*UNRECOVERED_JUMPTABLE)
                (uVar20,(long *)CONCAT44(extraout_var_12,iVar29),shape + 2,worldTransform,color,
                 UNRECOVERED_JUMPTABLE);
      return;
    }
    if (iVar29 == 0x25) {
      lVar36 = (long)*(int *)((long)&shape[1]._vptr_cbtCollisionShape + 4);
      if (lVar36 < 1) {
        return;
      }
      lVar35 = lVar36 + 1;
      lVar36 = lVar36 * 0x58 + -0x18;
      do {
        pvVar21 = shape[1].m_userPointer;
        uVar31 = *(uint *)((long)pvVar21 + lVar36 + -0x40);
        uVar16 = *(uint *)((long)pvVar21 + lVar36 + -0x3c);
        uVar1 = *(uint *)((long)pvVar21 + lVar36 + -0x38);
        fVar53 = *(float *)((long)pvVar21 + lVar36 + -0x30);
        fVar52 = *(float *)((long)pvVar21 + lVar36 + -0x2c);
        uVar2 = *(uint *)((long)pvVar21 + lVar36 + -0x28);
        uVar3 = *(uint *)((long)pvVar21 + lVar36 + -0x20);
        uVar4 = *(uint *)((long)pvVar21 + lVar36 + -0x1c);
        uVar5 = *(uint *)((long)pvVar21 + lVar36 + -0x18);
        uVar6 = *(uint *)((long)pvVar21 + lVar36 + -0x10);
        fVar58 = *(float *)((long)pvVar21 + lVar36 + -0xc);
        uVar7 = *(uint *)((long)pvVar21 + lVar36 + -8);
        cVar8 = (worldTransform->m_basis).m_el[0].m_floats[0];
        fVar60 = (worldTransform->m_basis).m_el[0].m_floats[1];
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * fVar60)),ZEXT416(uVar31),
                                  ZEXT416((uint)cVar8));
        cVar9 = (worldTransform->m_basis).m_el[0].m_floats[2];
        auVar40 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar3),ZEXT416((uint)cVar9));
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * fVar60)),ZEXT416(uVar16),
                                  ZEXT416((uint)cVar8));
        auVar41 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar4),ZEXT416((uint)cVar9));
        auVar42 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416((uint)fVar60));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar1),ZEXT416((uint)cVar8));
        auVar43 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar5),ZEXT416((uint)cVar9));
        cVar10 = (worldTransform->m_basis).m_el[1].m_floats[0];
        cVar11 = (worldTransform->m_basis).m_el[1].m_floats[1];
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar53),ZEXT416((uint)cVar11));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar31),ZEXT416((uint)cVar10));
        cVar12 = (worldTransform->m_basis).m_el[1].m_floats[2];
        auVar44 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar3),ZEXT416((uint)cVar12));
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar52),ZEXT416((uint)cVar11));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar16),ZEXT416((uint)cVar10));
        auVar45 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar4),ZEXT416((uint)cVar12));
        auVar42 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416((uint)cVar11));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar1),ZEXT416((uint)cVar10));
        auVar46 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar5),ZEXT416((uint)cVar12));
        cVar13 = (worldTransform->m_basis).m_el[2].m_floats[0];
        cVar14 = (worldTransform->m_basis).m_el[2].m_floats[1];
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar53),ZEXT416((uint)cVar14));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar13),ZEXT416(uVar31));
        cVar15 = (worldTransform->m_basis).m_el[2].m_floats[2];
        auVar51 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar15),ZEXT416(uVar3));
        auVar42 = vmulss_avx512f(ZEXT416((uint)fVar52),ZEXT416((uint)cVar14));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar13),ZEXT416(uVar16));
        auVar49 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar15),ZEXT416(uVar4));
        auVar42 = vmulss_avx512f(ZEXT416(uVar2),ZEXT416((uint)cVar14));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar13),ZEXT416(uVar1));
        auVar50 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar15),ZEXT416(uVar5));
        auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar58)),ZEXT416(uVar6),
                                  ZEXT416((uint)cVar8));
        auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar7),ZEXT416((uint)cVar9));
        auVar47 = vmulss_avx512f(ZEXT416((uint)fVar58),ZEXT416((uint)cVar11));
        auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416(uVar6),ZEXT416((uint)cVar10));
        auVar48 = vfmadd231ss_avx512f(auVar47,ZEXT416(uVar7),ZEXT416((uint)cVar12));
        auVar47 = vmulss_avx512f(ZEXT416((uint)fVar58),ZEXT416((uint)cVar14));
        auVar47 = vfmadd231ss_avx512f(auVar47,ZEXT416(uVar6),ZEXT416((uint)cVar13));
        auVar47 = vfmadd231ss_fma(auVar47,ZEXT416(uVar7),ZEXT416((uint)cVar15));
        auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ +
                                              (worldTransform->m_origin).m_floats[0])),
                                ZEXT416((uint)(auVar48._0_4_ +
                                              (worldTransform->m_origin).m_floats[1])),0x10);
        auStack_98 = vinsertps_avx(auVar42,ZEXT416((uint)(auVar47._0_4_ +
                                                         (worldTransform->m_origin).m_floats[2])),
                                   0x28);
        local_c8._4_4_ = auVar41._0_4_;
        local_c8._0_4_ = auVar40._0_4_;
        cStack_c0._vptr_cbtInternalTriangleIndexCallback._0_4_ = auVar43._0_4_;
        cStack_c0._vptr_cbtInternalTriangleIndexCallback._4_4_ = 0;
        local_b8 = CONCAT44(auVar45._0_4_,auVar44._0_4_);
        local_b0 = (ulong)auVar46._0_4_;
        uStack_a8 = CONCAT44(auVar49._0_4_,auVar51._0_4_);
        local_a0 = (ulong)auVar50._0_4_;
        (*this->_vptr_cbtCollisionWorld[7])
                  (this,local_c8,*(undefined8 *)((long)pvVar21 + lVar36),color);
        lVar35 = lVar35 + -1;
        lVar36 = lVar36 + -0x58;
      } while (1 < lVar35);
      return;
    }
    goto switchD_008d1b78_caseD_c;
  }
  switch(iVar29) {
  case 8:
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    UNRECOVERED_JUMPTABLE = *(code **)(*(long *)CONCAT44(extraout_var_01,iVar29) + 0x30);
    (*UNRECOVERED_JUMPTABLE)
              (in_XMM0_Da,(long *)CONCAT44(extraout_var_01,iVar29),worldTransform,color,
               UNRECOVERED_JUMPTABLE);
    return;
  case 9:
    lVar36 = (long)*(int *)&shape[3].field_0xc;
    if (lVar36 < 1) {
      return;
    }
    lVar35 = lVar36 + 1;
    lVar36 = lVar36 << 4;
    local_d0 = color;
    do {
      auVar45 = in_ZMM18._0_16_;
      auVar42 = in_ZMM19._0_16_;
      lVar32 = *(long *)&shape[3].m_userIndex;
      uVar31 = *(uint *)(lVar32 + -0x10 + lVar36);
      uVar16 = *(uint *)(lVar32 + -0xc + lVar36);
      uVar1 = *(uint *)(lVar32 + -8 + lVar36);
      iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
      fVar53 = (worldTransform->m_basis).m_el[0].m_floats[0];
      cVar8 = (worldTransform->m_basis).m_el[0].m_floats[1];
      auVar51 = vxorps_avx512vl(auVar42,auVar42);
      auVar49 = vmulss_avx512f(ZEXT416((uint)cVar8),auVar51);
      fVar52 = (worldTransform->m_basis).m_el[0].m_floats[2];
      auVar50 = vfmadd231ss_avx512f(ZEXT416((uint)(fVar53 + auVar49._0_4_)),ZEXT416((uint)fVar52),
                                    auVar51);
      auVar46 = ZEXT416((uint)fVar53);
      auVar42 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar46,ZEXT416((uint)cVar8));
      auVar47 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar52),auVar51);
      auVar49 = vfmadd231ss_avx512f(auVar49,auVar46,auVar51);
      fVar53 = (worldTransform->m_basis).m_el[1].m_floats[0];
      cVar9 = (worldTransform->m_basis).m_el[1].m_floats[1];
      auVar40 = vmulss_avx512f(ZEXT416((uint)cVar9),auVar51);
      fVar58 = (worldTransform->m_basis).m_el[1].m_floats[2];
      auVar41 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ + fVar53)),ZEXT416((uint)fVar58),
                                    auVar51);
      auVar48 = ZEXT416((uint)fVar53);
      auVar42 = vfmadd213ss_fma(ZEXT816(0) << 0x40,auVar48,ZEXT416((uint)cVar9));
      auVar43 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)fVar58),auVar51);
      auVar40 = vfmadd231ss_avx512f(auVar40,auVar48,auVar51);
      cVar10 = (worldTransform->m_basis).m_el[2].m_floats[0];
      cVar11 = (worldTransform->m_basis).m_el[2].m_floats[1];
      auVar42 = vmulss_avx512f(ZEXT416((uint)cVar11),auVar51);
      auVar44 = vaddss_avx512f(ZEXT416((uint)cVar10),auVar42);
      cVar12 = (worldTransform->m_basis).m_el[2].m_floats[2];
      auVar44 = vfmadd231ss_avx512f(auVar44,ZEXT416((uint)cVar12),auVar51);
      auVar45 = vxorps_avx512vl(auVar45,auVar45);
      auVar45 = vfmadd213ss_avx512f(auVar45,ZEXT416((uint)cVar10),ZEXT416((uint)cVar11));
      auVar45 = vfmadd231ss_avx512f(auVar45,ZEXT416((uint)cVar12),auVar51);
      in_ZMM18 = ZEXT1664(auVar45);
      auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416((uint)cVar10),auVar51);
      auVar51 = vaddss_avx512f(ZEXT416((uint)cVar12),auVar42);
      auVar42 = vmulss_avx512f(ZEXT416(uVar16),ZEXT416((uint)cVar8));
      in_ZMM19 = ZEXT464(uVar31);
      auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar31),auVar46);
      auVar42 = vfmadd231ss_avx512f(auVar42,ZEXT416(uVar1),ZEXT416((uint)fVar52));
      auVar46 = vmulss_avx512f(ZEXT416(uVar16),ZEXT416((uint)cVar9));
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar31),auVar48);
      auVar46 = vfmadd231ss_avx512f(auVar46,ZEXT416(uVar1),ZEXT416((uint)fVar58));
      auVar48 = vmulss_avx512f(ZEXT416(uVar16),ZEXT416((uint)cVar11));
      auVar48 = vfmadd231ss_avx512f(auVar48,ZEXT416(uVar31),ZEXT416((uint)cVar10));
      auVar48 = vfmadd231ss_avx512f(auVar48,ZEXT416(uVar1),ZEXT416((uint)cVar12));
      auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + (worldTransform->m_origin).m_floats[0])
                                     ),ZEXT416((uint)(auVar46._0_4_ +
                                                     (worldTransform->m_origin).m_floats[1])),0x10);
      auStack_98 = vinsertps_avx(auVar42,ZEXT416((uint)(auVar48._0_4_ +
                                                       (worldTransform->m_origin).m_floats[2])),0x28
                                );
      local_c8._4_4_ = auVar47._0_4_;
      local_c8._0_4_ = auVar50._0_4_;
      cStack_c0._vptr_cbtInternalTriangleIndexCallback._0_4_ = (uint)(fVar52 + auVar49._0_4_);
      cStack_c0._vptr_cbtInternalTriangleIndexCallback._4_4_ = 0;
      local_b8 = CONCAT44(auVar43._0_4_,auVar41._0_4_);
      local_b0 = (ulong)(uint)(fVar58 + auVar40._0_4_);
      uStack_a8 = CONCAT44(auVar45._0_4_,auVar44._0_4_);
      local_a0 = (ulong)auVar51._0_4_;
      (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar29) + 0x30))
                (*(undefined4 *)(*(long *)&shape[4].m_userIndex + -8 + lVar35 * 4),
                 (long *)CONCAT44(extraout_var_10,iVar29),local_c8,local_d0);
      lVar35 = lVar35 + -1;
      lVar36 = lVar36 + -0x10;
    } while (1 < lVar35);
    return;
  case 10:
    iVar29 = *(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    uVar38 = (ulong)iVar29;
    local_128 = *(float *)(&shape[1].field_0xc + (long)(iVar29 + 2 + ((iVar29 + 2) / 3) * -3) * 4);
    local_138 = *(float *)(&shape[1].field_0xc + uVar38 * 4);
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar33 = (long *)CONCAT44(extraout_var_09,iVar29);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar33 + 0xa8);
    break;
  case 0xb:
    local_128 = (float)shape[2].m_shapeType;
    local_138 = *(float *)&shape[2].field_0xc;
    uVar31 = *(uint *)((long)&shape[2].m_userPointer + 4);
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar33 = (long *)CONCAT44(extraout_var_07,iVar29);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar33 + 0xb8);
    uVar38 = (ulong)uVar31;
    goto LAB_008d28d1;
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
    goto switchD_008d1b78_caseD_c;
  case 0xd:
    uVar38 = (ulong)*(int *)((long)&shape[2]._vptr_cbtCollisionShape + 4);
    (*shape->_vptr_cbtCollisionShape[0x17])(shape);
    uVar55 = *(ulong *)&shape[1].field_0xc;
    local_108 = (float)uVar55;
    uVar54 = *(ulong *)((long)&shape[1].m_userPointer + 4);
    uVar56 = uVar54;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    fVar53 = (float)uVar56;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_e8 = CONCAT44(local_e8._4_4_,fVar53);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uVar55;
    auVar42 = vmovshdup_avx(auVar27);
    auVar42 = vinsertps_avx(ZEXT416((uint)(local_108 + (float)uVar56)),
                            ZEXT416((uint)(auVar42._0_4_ + (float)local_e8)),0x10);
    auVar26._8_8_ = 0;
    auVar26._0_8_ = uVar54;
    auVar51 = vinsertps_avx(ZEXT416((uint)((float)uVar54 + fVar53)),auVar26,0x5c);
    _local_c8 = vmovlhps_avx(auVar42,auVar51);
    local_138 = *(float *)(local_c8 + uVar38 * 4);
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar33 = (long *)CONCAT44(extraout_var_11,iVar29);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar33 + 0xb0);
    local_128 = in_XMM0_Da;
    break;
  case 0x14:
    fVar53 = *(float *)&shape[1].field_0xc;
    local_128 = fVar53;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_128 = local_128 + fVar53;
    uVar38 = *(ulong *)&shape[1].field_0xc;
    uVar55 = uVar38;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    local_138 = (float)uVar55;
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    (*shape->_vptr_cbtCollisionShape[0xc])(shape);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uVar38;
    auVar42 = vmovshdup_avx(auVar25);
    local_138 = auVar42._0_4_ + local_138;
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    plVar33 = (long *)CONCAT44(extraout_var_08,iVar29);
    UNRECOVERED_JUMPTABLE = *(code **)(*plVar33 + 0xb0);
    uVar38 = 1;
    goto LAB_008d28d1;
  case 0x17:
    pdVar22 = *(double **)&shape[2].m_shapeType;
    puVar23 = (ulong *)shape[2].m_userPointer;
    puVar24 = *(ulong **)&shape[2].m_userIndex;
    fVar53 = (worldTransform->m_origin).m_floats[0];
    fVar52 = (worldTransform->m_origin).m_floats[1];
    fVar58 = (worldTransform->m_origin).m_floats[2];
    auVar46._0_4_ = (float)*pdVar22;
    auVar46._4_12_ = auVar61;
    fVar62 = (float)pdVar22[1];
    auVar48._0_4_ = (float)pdVar22[2];
    auVar48._4_12_ = auVar63;
    cVar8 = (worldTransform->m_basis).m_el[0].m_floats[0];
    fVar60 = (worldTransform->m_basis).m_el[0].m_floats[1];
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar62)),ZEXT416((uint)cVar8),auVar46);
    cVar9 = (worldTransform->m_basis).m_el[0].m_floats[2];
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)cVar9),auVar48);
    cVar10 = (worldTransform->m_basis).m_el[1].m_floats[0];
    fVar59 = (worldTransform->m_basis).m_el[1].m_floats[1];
    auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar62)),ZEXT416((uint)cVar10),auVar46);
    cVar11 = (worldTransform->m_basis).m_el[1].m_floats[2];
    auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)cVar11),auVar48);
    cVar12 = (worldTransform->m_basis).m_el[2].m_floats[0];
    fVar57 = (worldTransform->m_basis).m_el[2].m_floats[1];
    auVar47 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar62)),ZEXT416((uint)cVar12),auVar46);
    cVar13 = (worldTransform->m_basis).m_el[2].m_floats[2];
    auVar47 = vfmadd231ss_fma(auVar47,ZEXT416((uint)cVar13),auVar48);
    auVar49 = vinsertps_avx(ZEXT416((uint)(auVar49._0_4_ + fVar53)),
                            ZEXT416((uint)(auVar50._0_4_ + fVar52)),0x10);
    _local_c8 = vinsertps_avx(auVar49,ZEXT416((uint)(fVar58 + auVar47._0_4_)),0x28);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = *puVar23;
    auVar49 = vcvtsd2ss_avx512f(auVar42,auVar47);
    auVar40._8_8_ = 0;
    auVar40._0_8_ = puVar23[1];
    auVar50 = vcvtsd2ss_avx512f(auVar42,auVar40);
    auVar41._8_8_ = 0;
    auVar41._0_8_ = puVar23[2];
    auVar47 = vcvtsd2ss_avx512f(auVar42,auVar41);
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * auVar50._0_4_)),ZEXT416((uint)cVar8),auVar49);
    auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cVar9),auVar47);
    auVar40 = vmulss_avx512f(ZEXT416((uint)fVar59),auVar50);
    auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar10),auVar49);
    auVar40 = vfmadd231ss_avx512f(auVar40,ZEXT416((uint)cVar11),auVar47);
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * auVar50._0_4_)),ZEXT416((uint)cVar12),auVar49)
    ;
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)cVar13),auVar47);
    auVar50 = vaddss_avx512f(ZEXT416((uint)fVar52),auVar40);
    auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + fVar53)),auVar50,0x10);
    _local_f8 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar58 + auVar49._0_4_)),0x28);
    auVar43._8_8_ = 0;
    auVar43._0_8_ = *puVar24;
    auVar49 = vcvtsd2ss_avx512f(auVar51,auVar43);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = puVar24[1];
    auVar42 = vcvtsd2ss_avx512f(auVar51,auVar44);
    fVar62 = auVar42._0_4_;
    auVar45._8_8_ = 0;
    auVar45._0_8_ = puVar24[2];
    auVar50 = vcvtsd2ss_avx512f(auVar51,auVar45);
    auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar62)),auVar49,ZEXT416((uint)cVar8));
    auVar42 = vfmadd231ss_fma(auVar42,auVar50,ZEXT416((uint)cVar9));
    auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar59 * fVar62)),auVar49,ZEXT416((uint)cVar10));
    auVar51 = vfmadd231ss_fma(auVar51,auVar50,ZEXT416((uint)cVar11));
    auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar57 * fVar62)),ZEXT416((uint)cVar12),auVar49);
    auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)cVar13),auVar50);
    auVar42 = vinsertps_avx(ZEXT416((uint)(fVar53 + auVar42._0_4_)),
                            ZEXT416((uint)(fVar52 + auVar51._0_4_)),0x10);
    local_60 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar58 + auVar49._0_4_)),0x28);
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar29) + 0x48))
              (0x3f800000,(long *)CONCAT44(extraout_var_06,iVar29),local_c8,local_f8,local_60,color)
    ;
    return;
  default:
    if (iVar29 == 0) {
      uVar38 = *(ulong *)&shape[1].field_0xc;
      uVar55 = *(ulong *)((long)&shape[1].m_userPointer + 4);
      uVar54 = uVar55;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      fVar52 = (float)uVar54;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      fVar53 = fVar52;
      (*shape->_vptr_cbtCollisionShape[0xc])(shape);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = uVar38;
      auVar42 = vmovshdup_avx(auVar42);
      auVar42 = vinsertps_avx(ZEXT416((uint)((float)uVar38 + (float)uVar54)),
                              ZEXT416((uint)(auVar42._0_4_ + fVar52)),0x10);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = uVar55;
      auVar51 = vinsertps_avx(ZEXT416((uint)((float)uVar55 + fVar53)),auVar51,0x5c);
      _local_c8 = vmovlhps_avx(auVar42,auVar51);
      iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
      auVar50._0_4_ = (uint)cStack_c0._vptr_cbtInternalTriangleIndexCallback ^ 0x80000000;
      auVar50._4_4_ = 0x80000000;
      auVar50._8_4_ = 0x80000000;
      auVar50._12_4_ = 0x80000000;
      auVar49._0_8_ = local_c8 ^ 0x8000000080000000;
      auVar49._8_4_ = (uint)cStack_c0._vptr_cbtInternalTriangleIndexCallback ^ 0x80000000;
      auVar49._12_4_ = local_c8._12_4_ ^ 0x80000000;
      _local_f8 = vinsertps_avx(auVar49,auVar50,0x28);
      (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar29) + 0xa0))
                ((long *)CONCAT44(extraout_var_02,iVar29),local_f8,local_c8,worldTransform,color);
      return;
    }
    goto switchD_008d1b78_caseD_c;
  }
  uVar38 = uVar38 & 0xffffffff;
LAB_008d28d1:
  (*UNRECOVERED_JUMPTABLE)
            (local_128,local_138,plVar33,uVar38,worldTransform,color,UNRECOVERED_JUMPTABLE);
  return;
switchD_008d1b78_caseD_c:
  local_e0 = shape;
  if (iVar29 < 7) {
    lVar36 = *(long *)&shape[2].m_shapeType;
    if (lVar36 == 0) {
      iVar29 = (*shape->_vptr_cbtCollisionShape[0x1a])();
      pcVar28 = local_e0;
      if (0 < iVar29) {
        uVar31 = 0;
        do {
          (*pcVar28->_vptr_cbtCollisionShape[0x1b])(pcVar28,(ulong)uVar31,local_c8,local_f8);
          fVar53 = (worldTransform->m_basis).m_el[0].m_floats[1];
          auVar47 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)((float)local_c8._4_4_ * fVar53)),
                                    ZEXT416((uint)local_c8._0_4_),auVar47);
          auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)cStack_c0.
                                                          _vptr_cbtInternalTriangleIndexCallback),
                                    auVar40);
          fVar52 = (worldTransform->m_basis).m_el[1].m_floats[1];
          auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * (float)local_c8._4_4_)),
                                    ZEXT416((uint)local_c8._0_4_),auVar41);
          auVar43 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
          auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)cStack_c0.
                                                          _vptr_cbtInternalTriangleIndexCallback),
                                    auVar43);
          fVar58 = (worldTransform->m_basis).m_el[2].m_floats[1];
          auVar44 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)local_c8._4_4_)),auVar44,
                                    ZEXT416((uint)local_c8._0_4_));
          auVar50 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
          auVar49 = vfmadd231ss_fma(auVar49,auVar50,
                                    ZEXT416((uint)cStack_c0._vptr_cbtInternalTriangleIndexCallback))
          ;
          fVar60 = (worldTransform->m_origin).m_floats[0];
          fVar59 = (worldTransform->m_origin).m_floats[1];
          auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + fVar60)),
                                  ZEXT416((uint)(auVar51._0_4_ + fVar59)),0x10);
          fVar57 = (worldTransform->m_origin).m_floats[2];
          local_60 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar57 + auVar49._0_4_)),0x28);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar53 * (float)local_f8._4_4_)),
                                    ZEXT416((uint)local_f8._0_4_),auVar47);
          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)uStack_f0),auVar40);
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * (float)local_f8._4_4_)),
                                    ZEXT416((uint)local_f8._0_4_),auVar41);
          auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)uStack_f0),auVar43);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * (float)local_f8._4_4_)),
                                    ZEXT416((uint)local_f8._0_4_),auVar44);
          auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)uStack_f0),auVar50);
          auVar42 = vinsertps_avx(ZEXT416((uint)(fVar60 + auVar42._0_4_)),
                                  ZEXT416((uint)(fVar59 + auVar51._0_4_)),0x10);
          local_40 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar57 + auVar49._0_4_)),0x28);
          iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
          (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar29) + 0x20))
                    ((long *)CONCAT44(extraout_var_13,iVar29),local_60,local_40,color);
          uVar31 = uVar31 + 1;
          iVar29 = (*pcVar28->_vptr_cbtCollisionShape[0x1a])(pcVar28);
        } while ((int)uVar31 < iVar29);
      }
    }
    else if (0 < *(int *)(lVar36 + 0x2c)) {
      lVar35 = 0;
      local_d0 = color;
      do {
        local_50 = lVar35 * 0x30;
        local_d8 = (long)*(int *)(*(long *)(lVar36 + 0x38) + 4 + local_50);
        fVar53 = 0.0;
        local_48 = lVar35;
        fVar52 = 0.0;
        if (local_d8 == 0) {
          fVar60 = 0.0;
          fVar58 = 0.0;
        }
        else {
          lVar32 = *(long *)(lVar36 + 0x38);
          fVar59 = 0.0;
          fVar57 = 0.0;
          fVar60 = 0.0;
          fVar58 = 0.0;
          if (0 < *(int *)(lVar32 + 4 + local_50)) {
            iVar29 = *(int *)(*(long *)(*(long *)(lVar36 + 0x38) + local_50 + 0x10) + -4 +
                             local_d8 * 4);
            lVar39 = 0;
            do {
              local_e8 = (long)*(int *)(*(long *)(lVar32 + 0x10 + lVar35 * 0x30) + lVar39 * 4);
              lVar32 = *(long *)(lVar36 + 0x18);
              lVar37 = local_e8 * 0x10;
              fVar53 = fVar53 + *(float *)(lVar32 + lVar37);
              fVar59 = fVar59 + *(float *)(lVar32 + 4 + lVar37);
              fVar57 = fVar57 + *(float *)(lVar32 + 8 + lVar37);
              iVar30 = (*this->_vptr_cbtCollisionWorld[5])(this);
              lVar32 = *(long *)(lVar36 + 0x18);
              lVar34 = (long)iVar29 * 0x10;
              uVar31 = *(uint *)(lVar32 + lVar34);
              fVar52 = *(float *)(lVar32 + 4 + lVar34);
              fVar58 = (worldTransform->m_basis).m_el[0].m_floats[1];
              auVar47 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
              auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar52 * fVar58)),ZEXT416(uVar31),auVar47);
              uVar16 = *(uint *)(lVar32 + 8 + lVar34);
              auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
              auVar42 = vfmadd231ss_fma(auVar42,ZEXT416(uVar16),auVar40);
              fVar60 = (worldTransform->m_basis).m_el[1].m_floats[1];
              auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
              auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar52)),ZEXT416(uVar31),auVar41);
              auVar43 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
              auVar51 = vfmadd231ss_fma(auVar51,ZEXT416(uVar16),auVar43);
              fVar62 = (worldTransform->m_basis).m_el[2].m_floats[1];
              auVar44 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar62 * fVar52)),auVar44,ZEXT416(uVar31));
              auVar50 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
              auVar49 = vfmadd231ss_fma(auVar49,auVar50,ZEXT416(uVar16));
              fVar52 = (worldTransform->m_origin).m_floats[0];
              fVar17 = (worldTransform->m_origin).m_floats[1];
              auVar42 = vinsertps_avx(ZEXT416((uint)(auVar42._0_4_ + fVar52)),
                                      ZEXT416((uint)(auVar51._0_4_ + fVar17)),0x10);
              fVar18 = (worldTransform->m_origin).m_floats[2];
              _local_c8 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar18 + auVar49._0_4_)),0x28);
              uVar31 = *(uint *)(lVar32 + lVar37);
              fVar19 = *(float *)(lVar32 + 4 + lVar37);
              auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar58 * fVar19)),ZEXT416(uVar31),auVar47);
              uVar16 = *(uint *)(lVar32 + 8 + lVar37);
              auVar42 = vfmadd231ss_fma(auVar42,ZEXT416(uVar16),auVar40);
              auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar60 * fVar19)),ZEXT416(uVar31),auVar41);
              auVar51 = vfmadd231ss_fma(auVar51,ZEXT416(uVar16),auVar43);
              auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar62 * fVar19)),ZEXT416(uVar31),auVar44);
              auVar49 = vfmadd231ss_fma(auVar49,ZEXT416(uVar16),auVar50);
              auVar42 = vinsertps_avx(ZEXT416((uint)(fVar52 + auVar42._0_4_)),
                                      ZEXT416((uint)(fVar17 + auVar51._0_4_)),0x10);
              _local_f8 = vinsertps_avx(auVar42,ZEXT416((uint)(fVar18 + auVar49._0_4_)),0x28);
              (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar30) + 0x20))
                        ((long *)CONCAT44(extraout_var_03,iVar30),local_c8,local_f8,local_d0);
              lVar39 = lVar39 + 1;
              lVar32 = *(long *)(lVar36 + 0x38);
              iVar29 = (int)local_e8;
              fVar60 = fVar59;
              fVar58 = fVar57;
              fVar52 = fVar53;
            } while (lVar39 < *(int *)(lVar32 + 4 + lVar35 * 0x30));
          }
        }
        iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
        uVar31 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar29) + 0x70))
                           ((long *)CONCAT44(extraout_var_04,iVar29));
        if ((uVar31 >> 0xe & 1) != 0) {
          fVar53 = 1.0 / (float)(int)(float)local_d8;
          fVar58 = fVar53 * fVar58;
          local_d8 = CONCAT44(local_d8._4_4_,fVar53 * fVar60);
          local_e8 = CONCAT44(local_e8._4_4_,fVar53 * fVar52);
          _local_c8 = ZEXT816(0x3f8000003f800000);
          lVar35 = *(long *)(lVar36 + 0x38);
          fVar62 = fVar53 * fVar52 + *(float *)(lVar35 + 0x20 + local_50);
          fVar17 = fVar53 * fVar60 + *(float *)(lVar35 + 0x24 + local_50);
          fVar18 = fVar58 + *(float *)(lVar35 + 0x28 + local_50);
          iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
          fVar53 = (worldTransform->m_basis).m_el[0].m_floats[1];
          auVar50 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[0]);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8 * fVar53)),
                                    ZEXT416((uint)(float)local_e8),auVar50);
          auVar47 = ZEXT416((uint)(worldTransform->m_basis).m_el[0].m_floats[2]);
          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar58),auVar47);
          fVar52 = (worldTransform->m_basis).m_el[1].m_floats[1];
          auVar40 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[0]);
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8 * fVar52)),
                                    ZEXT416((uint)(float)local_e8),auVar40);
          auVar41 = ZEXT416((uint)(worldTransform->m_basis).m_el[1].m_floats[2]);
          auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar58),auVar41);
          fVar60 = (worldTransform->m_basis).m_el[2].m_floats[1];
          auVar43 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[0]);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)((float)local_d8 * fVar60)),auVar43,
                                    ZEXT416((uint)(float)local_e8));
          auVar44 = ZEXT416((uint)(worldTransform->m_basis).m_el[2].m_floats[2]);
          auVar49 = vfmadd231ss_fma(auVar49,auVar44,ZEXT416((uint)fVar58));
          fVar58 = (worldTransform->m_origin).m_floats[0];
          fVar59 = (worldTransform->m_origin).m_floats[1];
          auVar42 = vinsertps_avx(ZEXT416((uint)(fVar58 + auVar42._0_4_)),
                                  ZEXT416((uint)(fVar59 + auVar51._0_4_)),0x10);
          fVar57 = (worldTransform->m_origin).m_floats[2];
          _local_f8 = vinsertps_avx(auVar42,ZEXT416((uint)(auVar49._0_4_ + fVar57)),0x28);
          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar53)),ZEXT416((uint)fVar62),auVar50);
          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar18),auVar47);
          auVar51 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar52)),ZEXT416((uint)fVar62),auVar40);
          auVar51 = vfmadd231ss_fma(auVar51,ZEXT416((uint)fVar18),auVar41);
          auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar17 * fVar60)),ZEXT416((uint)fVar62),auVar43);
          auVar49 = vfmadd231ss_fma(auVar49,ZEXT416((uint)fVar18),auVar44);
          auVar42 = vinsertps_avx(ZEXT416((uint)(fVar58 + auVar42._0_4_)),
                                  ZEXT416((uint)(fVar59 + auVar51._0_4_)),0x10);
          local_60 = vinsertps_avx(auVar42,ZEXT416((uint)(auVar49._0_4_ + fVar57)),0x28);
          (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar29) + 0x20))
                    ((long *)CONCAT44(extraout_var_05,iVar29),local_f8,local_60,local_c8);
        }
        lVar35 = local_48 + 1;
        color = local_d0;
      } while (lVar35 < *(int *)(lVar36 + 0x2c));
    }
  }
  pcVar28 = local_e0;
  if (local_e0->m_shapeType - 0x19U < 0xb) {
    local_f8 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
    uStack_f0 = 0x5d5e0b6b;
    local_60._0_8_ = 0xdd5e0b6bdd5e0b6b;
    local_60._8_8_ = 0xdd5e0b6b;
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    local_b8 = CONCAT44(extraout_var_14,iVar29);
    cStack_c0._vptr_cbtInternalTriangleIndexCallback =
         (_func_int **)&PTR__DebugDrawcallback_00b701a0;
    local_c8 = (undefined1  [8])&PTR__DebugDrawcallback_00b70170;
    local_b0 = *(ulong *)color->m_floats;
    uStack_a8 = *(undefined8 *)(color->m_floats + 2);
    local_a0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
    auStack_98 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
    uStack_88 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
    local_80 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
    uStack_78 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
    local_70 = *(undefined8 *)(worldTransform->m_origin).m_floats;
    uStack_68 = *(undefined8 *)((worldTransform->m_origin).m_floats + 2);
    (*pcVar28->_vptr_cbtCollisionShape[0x10])(pcVar28,local_c8,local_60,local_f8);
    cbtInternalTriangleIndexCallback::~cbtInternalTriangleIndexCallback
              ((cbtInternalTriangleIndexCallback *)(local_c8 + 8));
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_c8);
  }
  pcVar28 = local_e0;
  if (local_e0->m_shapeType == 3) {
    uStack_f0 = 0x5d5e0b6b;
    local_f8 = (undefined1  [8])0x5d5e0b6b5d5e0b6b;
    local_60._8_8_ = 0xdd5e0b6b;
    local_60._0_8_ = 0xdd5e0b6bdd5e0b6b;
    iVar29 = (*this->_vptr_cbtCollisionWorld[5])(this);
    local_b8 = CONCAT44(extraout_var_15,iVar29);
    cStack_c0._vptr_cbtInternalTriangleIndexCallback =
         (_func_int **)&PTR__DebugDrawcallback_00b701a0;
    local_c8 = (undefined1  [8])&PTR__DebugDrawcallback_00b70170;
    local_b0 = *(ulong *)color->m_floats;
    uStack_a8 = *(undefined8 *)(color->m_floats + 2);
    local_a0 = *(ulong *)(worldTransform->m_basis).m_el[0].m_floats;
    auStack_98 = *(undefined1 (*) [16])((worldTransform->m_basis).m_el[0].m_floats + 2);
    uStack_88 = *(undefined8 *)((worldTransform->m_basis).m_el[1].m_floats + 2);
    local_80 = *(undefined8 *)(worldTransform->m_basis).m_el[2].m_floats;
    uStack_78 = *(undefined8 *)((worldTransform->m_basis).m_el[2].m_floats + 2);
    local_70 = *(undefined8 *)(worldTransform->m_origin).m_floats;
    uStack_68 = *(undefined8 *)((worldTransform->m_origin).m_floats + 2);
    (**(code **)(**(long **)&pcVar28[3].m_userIndex + 0x10))
              (*(long **)&pcVar28[3].m_userIndex,(cbtInternalTriangleIndexCallback *)(local_c8 + 8),
               local_60,local_f8);
    cbtInternalTriangleIndexCallback::~cbtInternalTriangleIndexCallback
              ((cbtInternalTriangleIndexCallback *)(local_c8 + 8));
    cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_c8);
  }
  return;
}

Assistant:

void cbtCollisionWorld::debugDrawObject(const cbtTransform& worldTransform, const cbtCollisionShape* shape, const cbtVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawFrames)
	{
        /* ***CHRONO*** Comment out */
		////getDebugDrawer()->drawTransform(worldTransform, .1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(shape);
		for (int i = compoundShape->getNumChildShapes() - 1; i >= 0; i--)
		{
			cbtTransform childTrans = compoundShape->getChildTransform(i);
			const cbtCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform * childTrans, colShape, color);
		}
	}
	else
	{
		switch (shape->getShapeType())
		{
			case CE_TRIANGLE_SHAPE_PROXYTYPE:	// ***CHRONO***
			{
				const cbtCEtriangleShape* triShape = static_cast<const cbtCEtriangleShape*>(shape);
				chrono::ChVector<>* v1 = triShape->get_p1();
				chrono::ChVector<>* v2 = triShape->get_p2();
				chrono::ChVector<>* v3 = triShape->get_p3();
				auto origin = worldTransform.getOrigin();
				auto vt1 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v1->x(), (cbtScalar)v1->y(), (cbtScalar)v1->z());
				auto vt2 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v2->x(), (cbtScalar)v2->y(), (cbtScalar)v2->z());
				auto vt3 = origin + worldTransform.getBasis() *  cbtVector3((cbtScalar)v3->x(), (cbtScalar)v3->y(), (cbtScalar)v3->z());
				getDebugDrawer()->drawTriangle(vt1, vt2, vt3,color,1);
				break;
			}
			case BOX_SHAPE_PROXYTYPE:
			{
				const cbtBoxShape* boxShape = static_cast<const cbtBoxShape*>(shape);
				cbtVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
				getDebugDrawer()->drawBox(-halfExtents, halfExtents, worldTransform, color);
				break;
			}

			case SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtSphereShape* sphereShape = static_cast<const cbtSphereShape*>(shape);
				cbtScalar radius = sphereShape->getMargin();  //radius doesn't include the margin, so draw with margin

				getDebugDrawer()->drawSphere(radius, worldTransform, color);
				break;
			}
			case MULTI_SPHERE_SHAPE_PROXYTYPE:
			{
				const cbtMultiSphereShape* multiSphereShape = static_cast<const cbtMultiSphereShape*>(shape);

				cbtTransform childTransform;
				childTransform.setIdentity();

				for (int i = multiSphereShape->getSphereCount() - 1; i >= 0; i--)
				{
					childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
					getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform * childTransform, color);
				}

				break;
			}
			case CAPSULE_SHAPE_PROXYTYPE:
			{
				const cbtCapsuleShape* capsuleShape = static_cast<const cbtCapsuleShape*>(shape);

				cbtScalar radius = capsuleShape->getRadius();
				cbtScalar halfHeight = capsuleShape->getHalfHeight();

				int upAxis = capsuleShape->getUpAxis();
				getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
			case CONE_SHAPE_PROXYTYPE:
			{
				const cbtConeShape* coneShape = static_cast<const cbtConeShape*>(shape);
				cbtScalar radius = coneShape->getRadius();  //+coneShape->getMargin();
				cbtScalar height = coneShape->getHeight();  //+coneShape->getMargin();

				int upAxis = coneShape->getConeUpIndex();
				getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
				break;
			}
			case CYLINDER_SHAPE_PROXYTYPE:
			{
				const cbtCylinderShape* cylinder = static_cast<const cbtCylinderShape*>(shape);
				int upAxis = cylinder->getUpAxis();
				cbtScalar radius = cylinder->getRadius();
				cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
				getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
				break;
			}
            case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                const cbtCylindricalShellShape* cylinder = static_cast<const cbtCylindricalShellShape*>(shape);
				cbtScalar radius = cylinder->getRadius();
                cbtScalar halfHeight = cylinder->getHalfExtentsWithMargin()[1];
                getDebugDrawer()->drawCylinder(radius, halfHeight, 1, worldTransform, color);
                break;
            }
			case STATIC_PLANE_PROXYTYPE:
			{
				const cbtStaticPlaneShape* staticPlaneShape = static_cast<const cbtStaticPlaneShape*>(shape);
				cbtScalar planeConst = staticPlaneShape->getPlaneConstant();
				const cbtVector3& planeNormal = staticPlaneShape->getPlaneNormal();
				getDebugDrawer()->drawPlane(planeNormal, planeConst, worldTransform, color);
				break;
			}
			default:
			{
				/// for polyhedral shapes
				if (shape->isPolyhedral())
				{
					cbtPolyhedralConvexShape* polyshape = (cbtPolyhedralConvexShape*)shape;

					int i;
					if (polyshape->getConvexPolyhedron())
					{
						const cbtConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
						for (i = 0; i < poly->m_faces.size(); i++)
						{
							cbtVector3 centroid(0, 0, 0);
							int numVerts = poly->m_faces[i].m_indices.size();
							if (numVerts)
							{
								int lastV = poly->m_faces[i].m_indices[numVerts - 1];
								for (int v = 0; v < poly->m_faces[i].m_indices.size(); v++)
								{
									int curVert = poly->m_faces[i].m_indices[v];
									centroid += poly->m_vertices[curVert];
									getDebugDrawer()->drawLine(worldTransform * poly->m_vertices[lastV], worldTransform * poly->m_vertices[curVert], color);
									lastV = curVert;
								}
							}
							centroid *= cbtScalar(1.f) / cbtScalar(numVerts);
							if (getDebugDrawer()->getDebugMode() & cbtIDebugDraw::DBG_DrawNormals)
							{
								cbtVector3 normalColor(1, 1, 0);
								cbtVector3 faceNormal(poly->m_faces[i].m_plane[0], poly->m_faces[i].m_plane[1], poly->m_faces[i].m_plane[2]);
								getDebugDrawer()->drawLine(worldTransform * centroid, worldTransform * (centroid + faceNormal), normalColor);
							}
						}
					}
					else
					{
						for (i = 0; i < polyshape->getNumEdges(); i++)
						{
							cbtVector3 a, b;
							polyshape->getEdge(i, a, b);
							cbtVector3 wa = worldTransform * a;
							cbtVector3 wb = worldTransform * b;
							getDebugDrawer()->drawLine(wa, wb, color);
						}
					}
				}

				if (shape->isConcave())
				{
					cbtConcaveShape* concaveMesh = (cbtConcaveShape*)shape;

					///@todo pass camera, for some culling? no -> we are not a graphics lib
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));

					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					concaveMesh->processAllTriangles(&drawCallback, aabbMin, aabbMax);
				}

				if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
				{
					cbtConvexTriangleMeshShape* convexMesh = (cbtConvexTriangleMeshShape*)shape;
					//todo: pass camera for some culling
					cbtVector3 aabbMax(cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT), cbtScalar(BT_LARGE_FLOAT));
					cbtVector3 aabbMin(cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT), cbtScalar(-BT_LARGE_FLOAT));
					//DebugDrawcallback drawCallback;
					DebugDrawcallback drawCallback(getDebugDrawer(), worldTransform, color);
					convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback, aabbMin, aabbMax);
				}
			}
		}
	}
}